

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.c
# Opt level: O3

void sk_getaddr(SockAddr *addr,char *buf,int buflen)

{
  int iVar1;
  
  if (addr->superfamily < IP) {
    strncpy(buf,addr->hostname,(long)buflen);
    buf[(long)buflen - 1] = '\0';
  }
  else {
    iVar1 = getnameinfo((sockaddr *)addr->ais->ai_addr,addr->ais->ai_addrlen,buf,buflen,(char *)0x0,
                        0,1);
    if (iVar1 != 0) {
      *buf = '\0';
      strncat(buf,"<unknown>",(long)(buflen + -1));
      return;
    }
  }
  return;
}

Assistant:

void sk_getaddr(SockAddr *addr, char *buf, int buflen)
{
    if (addr->superfamily == UNRESOLVED || addr->superfamily == UNIX) {
        strncpy(buf, addr->hostname, buflen);
        buf[buflen-1] = '\0';
    } else {
#ifndef NO_IPV6
        if (getnameinfo(addr->ais->ai_addr, addr->ais->ai_addrlen, buf, buflen,
                        NULL, 0, NI_NUMERICHOST) != 0) {
            buf[0] = '\0';
            strncat(buf, "<unknown>", buflen - 1);
        }
#else
        struct in_addr a;
        SockAddrStep step;
        START_STEP(addr, step);
        assert(SOCKADDR_FAMILY(addr, step) == AF_INET);
        a.s_addr = htonl(addr->addresses[0]);
        strncpy(buf, inet_ntoa(a), buflen);
        buf[buflen-1] = '\0';
#endif
    }
}